

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O2

void move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  MoveOnly1 *i;
  pointer pMVar3;
  long lVar4;
  pointer pMVar5;
  Executor *pEVar6;
  Enum EVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  int local_338;
  MoveOnly1 local_334;
  unsigned_long local_330;
  Expression_lhs<const_int_&> local_328;
  long local_318;
  vector<MoveOnly1,_std::allocator<MoveOnly1>_> vec;
  ResultBuilder DOCTEST_RB;
  Result local_280;
  long local_258;
  size_t N;
  shared_ptr<tf::WorkerInterface> local_248;
  Taskflow taskflow;
  Executor executor;
  
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&taskflow);
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 0x14) {
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
    local_318 = (long)*(int *)((long)&DAT_0015aca8 + lVar4);
    local_258 = lVar4;
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::clear(&taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           );
    N = 100000;
    std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>::vector
              (&vec,100000,(allocator_type *)&DOCTEST_RB.super_AssertData);
    for (pMVar3 = vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar3 != vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>._M_impl.
                  super__Vector_impl_data._M_finish; pMVar3 = pMVar3 + 1) {
      pMVar3->a = 1;
    }
    local_334.a = 100;
    tf::FlowBuilder::
    transform_reduce<__gnu_cxx::__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>,___gnu_cxx::__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>,_MoveOnly2,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:805:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:810:7),_tf::StaticPartitioner<tf::DefaultClosureWrapper>,_nullptr>
              ((FlowBuilder *)&DOCTEST_RB.super_AssertData,&taskflow,
               vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>._M_impl.
               super__Vector_impl_data._M_start,
               vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_334,local_318);
    pEVar6 = &executor;
    tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,pEVar6,&taskflow);
    std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,pEVar6);
    tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    EVar7 = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x334;
    DOCTEST_RB.super_AssertData.m_expr = "res.b == N + 100";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_328.lhs = &local_334.a;
    local_330 = 0x18704;
    local_328.m_at = EVar7;
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_280,(Expression_lhs<int_const&> *)&local_328,&local_330);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_280);
    doctest::String::~String(&local_280.m_decomp);
    dVar2 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                       (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if (extraout_AL != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::clear(&taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           );
    local_334.a = 0;
    tf::FlowBuilder::
    transform_reduce<__gnu_cxx::__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>,___gnu_cxx::__normal_iterator<MoveOnly1_*,_std::vector<MoveOnly1,_std::allocator<MoveOnly1>_>_>,_MoveOnly2,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:827:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:832:7),_tf::StaticPartitioner<tf::DefaultClosureWrapper>,_nullptr>
              ((FlowBuilder *)&DOCTEST_RB.super_AssertData,&taskflow,
               vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>._M_impl.
               super__Vector_impl_data._M_start,
               vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_334,local_318);
    pEVar6 = &executor;
    tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,pEVar6,&taskflow);
    std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,pEVar6);
    tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x34a;
    DOCTEST_RB.super_AssertData.m_expr = "res.b == N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_328.lhs = &local_334.a;
    local_328.m_at = EVar7;
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    doctest::detail::Expression_lhs<const_int_&>::operator==<unsigned_long,_nullptr>
              (&local_280,&local_328,&N);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_280);
    doctest::String::~String(&local_280.m_decomp);
    dVar2 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                       (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    if (extraout_AL_00 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    pMVar3 = vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pMVar5 = vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>._M_impl.
                  super__Vector_impl_data._M_start; pMVar5 != pMVar3; pMVar5 = pMVar5 + 1) {
      DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x34d;
      DOCTEST_RB.super_AssertData.m_expr = "i.a == -7";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_330 = CONCAT44(local_330._4_4_,0xfffffff9);
      local_328.lhs = &pMVar5->a;
      local_328.m_at = EVar7;
      DOCTEST_RB.super_AssertData.m_at = EVar7;
      doctest::detail::Expression_lhs<int_const&>::operator==
                (&local_280,(Expression_lhs<int_const&> *)&local_328,(int *)&local_330);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_280);
      doctest::String::~String(&local_280.m_decomp);
      dVar2 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                         (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if (extraout_AL_01 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    }
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::clear(&taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           );
    local_338 = 0;
    tf::FlowBuilder::
    reduce<__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,MoveOnly1,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly1&,MoveOnly1&)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>>
              ((FlowBuilder *)&DOCTEST_RB.super_AssertData,&taskflow,
               vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>._M_impl.
               super__Vector_impl_data._M_start,
               vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_338,local_318);
    pEVar6 = &executor;
    tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,pEVar6,&taskflow);
    std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,pEVar6);
    tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x35f;
    DOCTEST_RB.super_AssertData.m_expr = "red.a == -7*N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_330 = 0xfffffffffff551a0;
    local_328.lhs = &local_338;
    local_328.m_at = EVar7;
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_280,(Expression_lhs<int_const&> *)&local_328,&local_330);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_280);
    doctest::String::~String(&local_280.m_decomp);
    dVar2 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                       (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
    if (extraout_AL_02 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::clear(&taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           );
    local_338 = 0;
    tf::FlowBuilder::
    reduce<__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,__gnu_cxx::__normal_iterator<MoveOnly1*,std::vector<MoveOnly1,std::allocator<MoveOnly1>>>,MoveOnly1,move_only_transform_reduce<tf::StaticPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(MoveOnly1_const&,MoveOnly1_const&)_1_,tf::StaticPartitioner<tf::DefaultClosureWrapper>>
              ((FlowBuilder *)&DOCTEST_RB.super_AssertData,&taskflow,
               vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>._M_impl.
               super__Vector_impl_data._M_start,
               vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_338,local_318);
    pEVar6 = &executor;
    tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,pEVar6,&taskflow);
    std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,pEVar6);
    tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_reduce.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x36e;
    DOCTEST_RB.super_AssertData.m_expr = "red.a == -7*N";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_330 = 0xfffffffffff551a0;
    local_328.lhs = &local_338;
    local_328.m_at = EVar7;
    DOCTEST_RB.super_AssertData.m_at = EVar7;
    doctest::detail::Expression_lhs<int_const&>::operator==
              (&local_280,(Expression_lhs<int_const&> *)&local_328,&local_330);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_280);
    doctest::String::~String(&local_280.m_decomp);
    dVar2 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                       (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
    if (extraout_AL_03 != '\0') break;
    doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    std::_Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>::~_Vector_base
              (&vec.super__Vector_base<MoveOnly1,_std::allocator<MoveOnly1>_>);
    lVar4 = local_258 + 4;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)(SUB84(dVar2,0));
  return;
}

Assistant:

void move_only_transform_reduce(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  for(size_t c : {0, 1, 3, 7, 99}) {

    P partitioner(c);
  
    taskflow.clear();

    const size_t N = 100000;
    std::vector<MoveOnly1> vec(N);

    for(auto& i : vec) i.a = 1;

    MoveOnly2 res;
    res.b = 100;

    taskflow.transform_reduce(vec.begin(), vec.end(), res,
      [](MoveOnly2 m1, MoveOnly2 m2) {
        MoveOnly2 lres;
        lres.b = m1.b + m2.b;
        return lres;
      },
      [](const MoveOnly1& m) {
        MoveOnly2 n;
        n.b = m.a;
        return n;
      },
      partitioner
    );

    executor.run(taskflow).wait();

    REQUIRE(res.b == N + 100);
    
    // change vec data
    taskflow.clear();
    res.b = 0;
    
    taskflow.transform_reduce(vec.begin(), vec.end(), res,
      [](MoveOnly2&& m1, MoveOnly2&& m2) {
        MoveOnly2 lres;
        lres.b = m1.b + m2.b;
        return lres;
      },
      [](MoveOnly1& m) {
        MoveOnly2 n;
        n.b = m.a;
        m.a = -7;
        return n;
      },
      partitioner
    );

    executor.run(taskflow).wait();
    REQUIRE(res.b == N);

    for(const auto& i : vec) {
      REQUIRE(i.a == -7);
    }

    // reduce
    taskflow.clear();
    MoveOnly1 red;
    red.a = 0;

    taskflow.reduce(vec.begin(), vec.end(), red,
      [](MoveOnly1& m1, MoveOnly1& m2){
        MoveOnly1 lres;
        lres.a = m1.a + m2.a;
        return lres;
      },
      partitioner
    );  

    executor.run(taskflow).wait();
    REQUIRE(red.a == -7*N);
    
    taskflow.clear();
    red.a = 0;

    taskflow.reduce(vec.begin(), vec.end(), red,
      [](const MoveOnly1& m1, const MoveOnly1& m2){
        MoveOnly1 lres;
        lres.a = m1.a + m2.a;
        return lres;
      },
      partitioner
    );  

    executor.run(taskflow).wait();
    REQUIRE(red.a == -7*N);
  }
}